

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilePOSIX.cpp
# Opt level: O2

void __thiscall adios2::transport::FilePOSIX::Close(FilePOSIX *this)

{
  int iVar1;
  int *piVar2;
  allocator local_143;
  allocator local_142;
  allocator local_141;
  string local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  WaitForOpen(this);
  std::__cxx11::string::string((string *)&local_40,"close",(allocator *)&local_140);
  Transport::ProfilerStart(&this->super_Transport,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  piVar2 = __errno_location();
  *piVar2 = 0;
  iVar1 = close(this->m_FileDescriptor);
  this->m_Errno = *piVar2;
  std::__cxx11::string::string((string *)&local_60,"close",(allocator *)&local_140);
  Transport::ProfilerStop(&this->super_Transport,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (iVar1 == -1) {
    std::__cxx11::string::string((string *)&local_140,"Toolkit",&local_141);
    std::__cxx11::string::string((string *)&local_80,"transport::file::FilePOSIX",&local_142);
    std::__cxx11::string::string((string *)&local_a0,"Close",&local_143);
    std::operator+(&local_100,"couldn\'t close file ",&(this->super_Transport).m_Name);
    std::operator+(&local_e0,&local_100," ");
    SysErrMsg_abi_cxx11_(&local_120,this);
    std::operator+(&local_c0,&local_e0,&local_120);
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_140,&local_80,&local_a0,&local_c0,-1);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_140);
  }
  (this->super_Transport).m_IsOpen = false;
  return;
}

Assistant:

void FilePOSIX::Close()
{
    WaitForOpen();
    ProfilerStart("close");
    errno = 0;
    const int status = close(m_FileDescriptor);
    m_Errno = errno;
    ProfilerStop("close");

    if (status == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FilePOSIX", "Close",
                                              "couldn't close file " + m_Name + " " + SysErrMsg());
    }

    m_IsOpen = false;
}